

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool MultiplicationHelper<unsigned_long,_unsigned_int,_4>::Multiply
               (unsigned_long *t,uint *u,unsigned_long *ret)

{
  bool bVar1;
  undefined8 *in_RDX;
  bool f;
  uint64_t tmp;
  uint64_t t1;
  uint32_t in_stack_ffffffffffffffcc;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  
  bVar1 = LargeIntRegMultiply<unsigned_long,_unsigned_int>::RegMultiply
                    ((uint64_t *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc,(uint64_t *)0x1b1bbf);
  *in_RDX = 0;
  return bVar1;
}

Assistant:

static bool Multiply( const T& t, const U& u, T& ret ) SAFEINT_NOTHROW
    {
        static_assert( safeint_internal::int_traits<T>::isUint64, "T must be Uint64" );
        std::uint64_t t1 = t;
        std::uint64_t tmp = 0;
        bool f = LargeIntRegMultiply< std::uint64_t, std::uint32_t >::RegMultiply( t1, (std::uint32_t)u, &tmp );
        ret = tmp;
        return f;
    }